

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_style_push_font(nk_context *ctx,nk_user_font *font)

{
  int iVar1;
  nk_config_stack_user_font *pnVar2;
  nk_config_stack_user_font_element *pnVar3;
  nk_config_stack_user_font_element *element;
  nk_config_stack_user_font *font_stack;
  nk_user_font *font_local;
  nk_context *ctx_local;
  nk_bool local_4;
  
  if (ctx == (nk_context *)0x0) {
    local_4 = 0;
  }
  else {
    pnVar2 = &(ctx->stacks).fonts;
    if (pnVar2->head < 8) {
      iVar1 = pnVar2->head;
      pnVar2->head = iVar1 + 1;
      pnVar3 = (ctx->stacks).fonts.elements + iVar1;
      pnVar3->address = &(ctx->style).font;
      pnVar3->old_value = (ctx->style).font;
      (ctx->style).font = font;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_style_push_font(struct nk_context *ctx, const struct nk_user_font *font)
{
struct nk_config_stack_user_font *font_stack;
struct nk_config_stack_user_font_element *element;

NK_ASSERT(ctx);
if (!ctx) return 0;

font_stack = &ctx->stacks.fonts;
NK_ASSERT(font_stack->head < (int)NK_LEN(font_stack->elements));
if (font_stack->head >= (int)NK_LEN(font_stack->elements))
return 0;

element = &font_stack->elements[font_stack->head++];
element->address = &ctx->style.font;
element->old_value = ctx->style.font;
ctx->style.font = font;
return 1;
}